

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningParameter.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::DeadReckoningParameter::Encode(DeadReckoningParameter *this,KDataStream *stream)

{
  KDataStream *stream_00;
  ushort local_1a;
  KUINT16 i;
  KDataStream *stream_local;
  DeadReckoningParameter *this_local;
  
  KDataStream::operator<<(stream,this->m_ui8DeadRecknoningAlgorithm);
  for (local_1a = 0; local_1a < 0xf; local_1a = local_1a + 1) {
    KDataStream::operator<<(stream,this->m_OtherParams[local_1a]);
  }
  stream_00 = DATA_TYPE::operator<<(stream,&(this->m_LinearAcceleration).super_DataTypeBase);
  DATA_TYPE::operator<<(stream_00,&(this->m_AngularVelocity).super_DataTypeBase);
  return;
}

Assistant:

void DeadReckoningParameter::Encode( KDataStream & stream ) const
{
    stream << m_ui8DeadRecknoningAlgorithm;

    for( KUINT16 i = 0; i < 15; ++i )
    {
        stream << m_OtherParams[i];
    }

    stream << KDIS_STREAM m_LinearAcceleration
           << KDIS_STREAM m_AngularVelocity;
}